

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O3

Error __thiscall asmjit::VMemMgr::shrink(VMemMgr *this,void *p,size_t used)

{
  uint8_t *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Error EVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  size_t *psVar8;
  size_t *psVar9;
  MemNode *pMVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  size_t sVar14;
  bool bVar15;
  
  if (p == (void *)0x0) {
    return 0;
  }
  if (used == 0) {
    EVar4 = release(this,p);
    return EVar4;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  for (pMVar10 = this->_root; EVar4 = 3, pMVar10 != (MemNode *)0x0;
      pMVar10 = (MemNode *)(pMVar10->super_RbNode).node[0]) {
    puVar1 = (pMVar10->super_RbNode).mem;
    if (puVar1 <= p) {
      if (p < puVar1 + pMVar10->size) {
        uVar6 = pMVar10->density;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar6;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (long)p - (long)puVar1;
        uVar5 = SUB168(auVar3 / auVar2,0);
        uVar11 = 1L << (SUB161(auVar3 / auVar2,0) & 0x3f);
        uVar13 = uVar5 >> 6;
        sVar14 = pMVar10->baCont[uVar13];
        uVar6 = ((used + uVar6) - 1) / uVar6;
        EVar4 = 0;
        if ((sVar14 >> (uVar5 & 0x3f) & 1) != 0) {
          psVar8 = pMVar10->baCont + uVar13;
          psVar9 = pMVar10->baUsed + uVar13;
          sVar12 = *psVar9;
          goto LAB_00118aeb;
        }
        break;
      }
      pMVar10 = (MemNode *)((pMVar10->super_RbNode).node + 1);
    }
  }
  goto LAB_00118b82;
LAB_00118b16:
  sVar14 = ~uVar11 & sVar14;
  uVar11 = uVar11 * 2;
  if ((bool)(uVar11 == 0 | bVar15)) {
    *psVar9 = sVar12;
    *psVar8 = sVar14;
    if (bVar15) goto LAB_00118b68;
    sVar12 = psVar9[1];
    psVar9 = psVar9 + 1;
    sVar14 = psVar8[1];
    psVar8 = psVar8 + 1;
    uVar11 = 1;
  }
  bVar15 = (uVar11 & sVar14) == 0;
  sVar12 = sVar12 & ~uVar11;
  lVar7 = lVar7 + 1;
  goto LAB_00118b16;
LAB_00118b68:
  uVar6 = lVar7 * pMVar10->density;
  if (pMVar10->largestBlock < uVar6) {
    pMVar10->largestBlock = uVar6;
  }
  pMVar10->used = pMVar10->used - uVar6;
  this->_usedBytes = this->_usedBytes - uVar6;
  EVar4 = 0;
  goto LAB_00118b82;
  while( true ) {
    uVar11 = uVar11 * 2;
    if (uVar11 == 0) {
      sVar12 = psVar9[1];
      psVar9 = psVar9 + 1;
      sVar14 = psVar8[1];
      psVar8 = psVar8 + 1;
      uVar11 = 1;
    }
    EVar4 = 0;
    if ((uVar11 & sVar14) == 0) break;
LAB_00118aeb:
    uVar6 = uVar6 - 1;
    if (uVar6 == 0) {
      lVar7 = 0;
      bVar15 = false;
      goto LAB_00118b16;
    }
  }
LAB_00118b82:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return EVar4;
}

Assistant:

Error VMemMgr::shrink(void* p, size_t used) noexcept {
  if (!p) return kErrorOk;
  if (used == 0)
    return release(p);

  AutoLock locked(_lock);
  MemNode* node = vMemMgrFindNodeByPtr(this, (uint8_t*)p);
  if (!node) return DebugUtils::errored(kErrorInvalidArgument);

  size_t offset = (size_t)((uint8_t*)p - (uint8_t*)node->mem);
  size_t bitpos = M_DIV(offset, node->density);
  size_t i = (bitpos / kBitsPerEntity);

  size_t* up = node->baUsed + i;  // Current ubits address.
  size_t* cp = node->baCont + i;  // Current cbits address.
  size_t ubits = *up;             // Current ubits[0] value.
  size_t cbits = *cp;             // Current cbits[0] value.
  size_t bit = (size_t)1 << (bitpos % kBitsPerEntity);

  size_t cont = 0;
  size_t usedBlocks = (used + node->density - 1) / node->density;

  bool stop;

  // Find the first block we can mark as free.
  for (;;) {
    stop = (cbits & bit) == 0;
    if (stop)
      return kErrorOk;

    if (++cont == usedBlocks)
      break;

    bit <<= 1;
    if (bit == 0) {
      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // Free the tail blocks.
  cont = ~(size_t)0;
  goto _EnterFreeLoop;

  for (;;) {
    stop = (cbits & bit) == 0;
    ubits &= ~bit;

_EnterFreeLoop:
    cbits &= ~bit;

    bit <<= 1;
    cont++;

    if (stop || bit == 0) {
      *up = ubits;
      *cp = cbits;
      if (stop)
        break;

      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // Statistics.
  cont *= node->density;
  if (node->largestBlock < cont)
    node->largestBlock = cont;

  node->used -= cont;
  _usedBytes -= cont;

  return kErrorOk;
}